

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O2

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::StartArray(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *this)

{
  bool bVar1;
  Level *pLVar2;
  
  PrettyPrefix(this,kArrayType);
  pLVar2 = internal::Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
                     (&(this->
                       super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                       ).level_stack_,1);
  pLVar2->valueCount = 0;
  pLVar2->inArray = true;
  bVar1 = Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::WriteStartArray(&this->
                             super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                           );
  return bVar1;
}

Assistant:

bool StartArray() {
        PrettyPrefix(kArrayType);
        new (Base::level_stack_.template Push<typename Base::Level>()) typename Base::Level(true);
        return Base::WriteStartArray();
    }